

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

string * __thiscall
Assimp::parseUTF16String_abi_cxx11_
          (string *__return_storage_ptr__,Assimp *this,uint8_t *data,size_t len)

{
  DeadlyImportError *this_00;
  iterator start;
  iterator end;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result_00;
  value_type_conflict9 local_5a;
  pointer psStack_58;
  short v;
  size_t i;
  vector<short,_std::allocator<short>_> utf16;
  size_t numShorts;
  size_t len_local;
  uint8_t *data_local;
  string *result;
  
  if (((ulong)data & 1) == 0) {
    utf16.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)((ulong)data >> 1);
    std::vector<short,_std::allocator<short>_>::vector((vector<short,_std::allocator<short>_> *)&i);
    std::vector<short,_std::allocator<short>_>::reserve
              ((vector<short,_std::allocator<short>_> *)&i,
               (size_type)
               utf16.super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    len_local = (size_t)this;
    for (psStack_58 = (pointer)0x0;
        psStack_58 <
        utf16.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage; psStack_58 = (pointer)((long)psStack_58 + 1)) {
      local_5a = CONCAT11(*(undefined1 *)len_local,*(undefined1 *)(len_local + 1));
      std::vector<short,_std::allocator<short>_>::push_back
                ((vector<short,_std::allocator<short>_> *)&i,&local_5a);
      len_local = len_local + 2;
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    start = std::vector<short,_std::allocator<short>_>::begin
                      ((vector<short,_std::allocator<short>_> *)&i);
    end = std::vector<short,_std::allocator<short>_>::end
                    ((vector<short,_std::allocator<short>_> *)&i);
    result_00 = std::back_inserter<std::__cxx11::string>(__return_storage_ptr__);
    utf8::
    utf16to8<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,std::back_insert_iterator<std::__cxx11::string>>
              ((__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
               start._M_current,
               (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
               end._M_current,result_00);
    std::vector<short,_std::allocator<short>_>::~vector((vector<short,_std::allocator<short>_> *)&i)
    ;
    return __return_storage_ptr__;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

static std::string parseUTF16String(const uint8_t *data, size_t len) {
    if (len & 1) {
        throw DeadlyImportError(parseErrorMessage);
    }
    size_t numShorts = len / 2;
    std::vector<short> utf16;
    utf16.reserve(numShorts);
    for (size_t i = 0; i < numShorts; ++i) {
        short v = (data[0] << 8) | data[1];
        utf16.push_back(v);
        data += 2;
    }
    std::string result;
    utf8::utf16to8(utf16.begin(), utf16.end(), back_inserter(result));
    return result;
}